

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lib.c
# Opt level: O3

int32_t lj_lib_checkintrange(lua_State *L,int narg,int32_t a,int32_t b)

{
  double dVar1;
  uint uVar2;
  ulong uVar3;
  
  if (L->top <= L->base + (long)narg + -1) {
LAB_00117b58:
    lj_err_argt(L,narg,3);
  }
  dVar1 = L->base[(long)narg + -1].n;
  if ((ulong)((long)dVar1 >> 0x2f) < 0xfffffffffffffff2) {
    uVar2 = (uint)dVar1;
    uVar3 = (ulong)uVar2;
    if ((a <= (int)uVar2) && ((int)uVar2 <= b)) goto LAB_00117af3;
  }
  else {
    if ((long)dVar1 >> 0x2f != 0xfffffffffffffff5) goto LAB_00117b58;
    uVar3 = (ulong)dVar1 & 0x7fffffffffff;
    if (*(short *)(uVar3 + 10) == 0xc) {
      uVar3 = *(ulong *)(uVar3 + 0x10);
      if ((a < 0 || (uint)a <= uVar3) && (uVar3 <= (ulong)(long)b)) {
LAB_00117af3:
        return (int32_t)uVar3;
      }
    }
    else {
      if (*(short *)(uVar3 + 10) != 0xb) goto LAB_00117b58;
      uVar3 = *(ulong *)(uVar3 + 0x10);
      if (((long)a <= (long)uVar3) && ((long)uVar3 <= (long)b)) goto LAB_00117af3;
    }
  }
  lj_err_arg(L,narg,LJ_ERR_NUMRNG);
}

Assistant:

int32_t lj_lib_checkintrange(lua_State *L, int narg, int32_t a, int32_t b)
{
  TValue *o = L->base + narg-1;
  lj_assertL(b >= 0, "expected range must be non-negative");
  if (o < L->top) {
    if (LJ_LIKELY(tvisint(o))) {
      int32_t i = intV(o);
      if (i >= a && i <= b) return i;
    } else if (LJ_LIKELY(tvisnum(o))) {
      /* For performance reasons, this doesn't check for integerness or
      ** integer overflow. Overflow detection still works, since all FPUs
      ** return either MININT or MAXINT, which is then out of range.
      */
      int32_t i = (int32_t)numV(o);
      if (i >= a && i <= b) return i;
#if LJ_HASFFI
    } else if (tviscdata(o)) {
      GCcdata *cd = cdataV(o);
      if (cd->ctypeid == CTID_INT64) {
	int64_t i = *(int64_t *)cdataptr(cd);
	if (i >= (int64_t)a && i <= (int64_t)b) return (int32_t)i;
      } else if (cd->ctypeid == CTID_UINT64) {
	uint64_t i = *(uint64_t *)cdataptr(cd);
	if ((a < 0 || i >= (uint64_t)a) && i <= (uint64_t)b) return (int32_t)i;
      } else {
	goto badtype;
      }
#endif
    } else {
      goto badtype;
    }
    lj_err_arg(L, narg, LJ_ERR_NUMRNG);
  }
badtype:
  lj_err_argt(L, narg, LUA_TNUMBER);
  return 0;  /* unreachable */
}